

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O0

int newmodel(int p,int d,int q,int P,int D,int Q,int constant,double *result,int n)

{
  int iVar1;
  int lresult;
  int iter;
  int i;
  int Q_local;
  int D_local;
  int P_local;
  int q_local;
  int d_local;
  int p_local;
  
  lresult = 0;
  do {
    if (n <= lresult) {
      return 1;
    }
    iVar1 = lresult * 8;
    if (((double)p == result[iVar1]) && (!NAN((double)p) && !NAN(result[iVar1]))) {
      if (((double)d == result[iVar1 + 1]) && (!NAN((double)d) && !NAN(result[iVar1 + 1]))) {
        if (((double)q == result[iVar1 + 2]) && (!NAN((double)q) && !NAN(result[iVar1 + 2]))) {
          if (((double)P == result[iVar1 + 3]) && (!NAN((double)P) && !NAN(result[iVar1 + 3]))) {
            if (((double)D == result[iVar1 + 4]) && (!NAN((double)D) && !NAN(result[iVar1 + 4]))) {
              if (((double)Q == result[iVar1 + 5]) && (!NAN((double)Q) && !NAN(result[iVar1 + 5])))
              {
                if (((double)constant == result[iVar1 + 6]) &&
                   (!NAN((double)constant) && !NAN(result[iVar1 + 6]))) {
                  return 0;
                }
              }
            }
          }
        }
      }
    }
    lresult = lresult + 1;
  } while( true );
}

Assistant:

static int newmodel(int p, int d, int q, int P, int D, int Q, int constant, double *result, int n) {
	int i,iter, lresult;

	lresult = 8;

	for(i = 0; i < n;++i) {
		iter = i * lresult;
		if ((double)p == result[iter+0] && (double)d == result[iter+1] && (double)q == result[iter+2] && (double)P == result[iter+3] &&
		 (double)D == result[iter+4] && (double)Q == result[iter+5] && (double)constant == result[iter+6]) {
			return 0;
		}
	}

	return 1;
}